

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

int mpt::type_properties<mpt::span<const_float>_>::id(bool obtain)

{
  int iVar1;
  type_traits *ptVar2;
  undefined4 local_18;
  int type;
  bool obtain_local;
  
  if (id::_valtype < 1) {
    iVar1 = type_properties<float>::id(false);
    if ((iVar1 < 0x60) || (0x7a < iVar1)) {
      local_18 = 0;
    }
    else {
      local_18 = iVar1 - 0x20U & 0xff;
    }
    if (local_18 == 0) {
      if (obtain) {
        ptVar2 = _dynamic_traits();
        id::_valtype = mpt::type_traits::add(ptVar2);
        type = id::_valtype;
      }
      else {
        type = -3;
      }
    }
    else {
      id::_valtype = local_18;
      type = local_18;
    }
  }
  else {
    type = id::_valtype;
  }
  return type;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		/* use vector IDs for builtin types */
		int type = type_properties<T>::id(false);
		if ((type = MPT_type_toVector(type)) > 0) {
			return _valtype = type;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*_dynamic_traits());
	}